

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list_functions.h
# Opt level: O1

Token * LinkedList::delete_head<string_tokenizer::Token>
                  (Token *__return_storage_ptr__,Node<string_tokenizer::Token> **head)

{
  Node<string_tokenizer::Token> *pNVar1;
  pointer pcVar2;
  
  pNVar1 = *head;
  if (pNVar1 == (Node<string_tokenizer::Token> *)0x0) {
    string_tokenizer::Token::Token(__return_storage_ptr__);
  }
  else {
    (__return_storage_ptr__->_token)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_token).field_2;
    pcVar2 = (pNVar1->_item)._token._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + (pNVar1->_item)._token._M_string_length);
    __return_storage_ptr__->_type = (pNVar1->_item)._type;
    *head = (*head)->_next;
    pcVar2 = (pNVar1->_item)._token._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pNVar1->_item)._token.field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(pNVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

T delete_head(Node<T>*& head) {
        if (head == NULL) {
            return T();
        }
        Node<T>* hold = head;
        T hold_item = head->_item;
        head = head->_next;
        delete hold;
        return hold_item;
    }